

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
     DeleteHeapBlockList(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *list,
                        Recycler *recycler)

{
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::DeleteHeapBlockList(TBlockType * list, Recycler * recycler)
{
    HeapBlockList::ForEachEditing(list, [recycler](TBlockType * heapBlock)
    {
#if DBG
        heapBlock->ReleasePagesShutdown(recycler);
#endif
        TBlockType::Delete(heapBlock);
    });
}